

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86.cpp
# Opt level: O3

int __thiscall
ncnn::ConvolutionDepthWise_x86::forward
          (ConvolutionDepthWise_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float *pfVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  int iVar4;
  uint uVar5;
  int *piVar6;
  Layer *pLVar7;
  void *pvVar8;
  undefined4 *puVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  int iVar15;
  byte bVar16;
  int iVar17;
  uint uVar18;
  int iVar19;
  uint uVar20;
  int iVar21;
  int iVar22;
  sbyte sVar23;
  int iVar24;
  uint uVar25;
  int iVar26;
  uint uVar27;
  uint _w;
  int iVar28;
  byte bVar29;
  undefined7 uVar32;
  long lVar31;
  uint _elempack;
  ulong uVar33;
  void *pvVar34;
  int iVar35;
  Option *_elemsize;
  bool bVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  float fVar40;
  float fVar45;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  undefined4 uVar53;
  undefined4 uVar54;
  undefined4 uVar55;
  undefined4 uVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  v4sf one;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  undefined1 auVar65 [16];
  Option opt_p;
  vector<int,_std::allocator<int>_> _space_ofs;
  Mat m_1;
  Mat m;
  Option opt_g;
  int local_230;
  ulong local_220;
  Mat local_1e8;
  int local_19c;
  Mat local_198;
  Mat local_150;
  void *local_108;
  int *local_100;
  Allocator *local_f8;
  int local_f0;
  Allocator *local_e8;
  int local_e0;
  int local_dc;
  int local_d8;
  int local_d4;
  int local_d0;
  ulong local_c8;
  pointer local_c0;
  int *local_b8;
  ulong local_b0;
  int local_a8;
  Allocator *local_a0;
  int local_98;
  int local_94;
  int local_90;
  int local_8c;
  int local_88;
  ulong local_80;
  undefined8 local_78;
  Allocator *pAStack_70;
  Allocator *local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  int local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  Option *pOVar30;
  
  if ((opt->use_int8_inference == true) && ((this->super_ConvolutionDepthWise).int8_scale_term != 0)
     ) {
    iVar17 = forward_int8_x86(this,bottom_blob,top_blob,opt);
    return iVar17;
  }
  uVar20 = bottom_blob->c;
  uVar33 = bottom_blob->elemsize;
  iVar17 = (this->super_ConvolutionDepthWise).kernel_w;
  iVar35 = (this->super_ConvolutionDepthWise).dilation_w;
  iVar22 = (this->super_ConvolutionDepthWise).kernel_h;
  iVar4 = (this->super_ConvolutionDepthWise).dilation_h;
  iVar28 = bottom_blob->elempack;
  local_198.cstep = 0;
  local_198.data = (void *)0x0;
  local_198.refcount._0_4_ = 0;
  local_198.refcount._4_4_ = 0;
  local_198.elemsize._0_4_ = 0;
  local_198.elemsize._4_4_ = 0;
  local_198.elempack = 0;
  local_198.allocator = (Allocator *)0x0;
  local_198.dims = 0;
  local_198.w = 0;
  local_198.h = 0;
  local_198.d = 0;
  local_198.c = 0;
  ConvolutionDepthWise::make_padding(&this->super_ConvolutionDepthWise,bottom_blob,&local_198,opt);
  iVar15 = local_198.w;
  iVar21 = -100;
  if ((local_198.data == (void *)0x0) || ((long)local_198.c * local_198.cstep == 0))
  goto LAB_003dc794;
  iVar17 = (~((iVar17 + -1) * iVar35) + local_198.w) / (this->super_ConvolutionDepthWise).stride_w;
  iVar35 = (~((iVar22 + -1) * iVar4) + local_198.h) / (this->super_ConvolutionDepthWise).stride_h;
  _w = iVar17 + 1;
  uVar27 = (this->super_ConvolutionDepthWise).num_output;
  bVar16 = (uVar27 & 3) == 0 & opt->use_packing_layout;
  _elempack = (uint)bVar16 * 3 + 1;
  sVar23 = bVar16 * '\x02';
  _elemsize = (Option *)(uVar33 / (ulong)(long)iVar28 << sVar23);
  pOVar30 = _elemsize;
  Mat::create(top_blob,_w,iVar35 + 1,(int)uVar27 / (int)_elempack,(size_t)_elemsize,_elempack,
              opt->blob_allocator);
  if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0))
  goto LAB_003dc794;
  uVar18 = uVar20 * iVar28;
  uVar27 = (this->super_ConvolutionDepthWise).num_output;
  uVar5 = (this->super_ConvolutionDepthWise).group;
  if (uVar5 == uVar27 && (uVar18 ^ uVar5) == 0) {
    if (iVar28 == 1) {
      auVar37._0_4_ = -(uint)((this->super_ConvolutionDepthWise).kernel_w == 3);
      auVar37._4_4_ = -(uint)((this->super_ConvolutionDepthWise).kernel_h == 3);
      auVar37._8_4_ = -(uint)((this->super_ConvolutionDepthWise).dilation_w == 1);
      auVar37._12_4_ = -(uint)((this->super_ConvolutionDepthWise).dilation_h == 1);
      uVar25 = movmskps(uVar18 ^ uVar5,auVar37);
      iVar17 = (this->super_ConvolutionDepthWise).stride_w;
      uVar20 = (this->super_ConvolutionDepthWise).stride_h;
      if (uVar20 == 1 && (iVar17 == 1 && (uVar25 ^ 0xf) == 0)) {
        convdw3x3s1_sse(&local_198,top_blob,(Mat *)(this->weight_data_tm).data,
                        (Mat *)(this->super_ConvolutionDepthWise).bias_data.data,
                        (Option *)(ulong)uVar20);
      }
      else {
        bVar36 = (char)(uVar25 ^ 0xf) == '\0';
        if ((uVar20 != 2 || iVar17 != 2) || !bVar36) goto LAB_003dbaa4;
        convdw3x3s2_sse(&local_198,top_blob,(Mat *)(this->weight_data_tm).data,
                        (Mat *)(this->super_ConvolutionDepthWise).bias_data.data,
                        (Option *)
                        (ulong)CONCAT31((int3)(uVar20 >> 8),(uVar20 == 2 && iVar17 == 2) && bVar36))
        ;
      }
      goto LAB_003dc0a4;
    }
    if (iVar28 != 4) goto LAB_003dbaa4;
    iVar28 = (this->super_ConvolutionDepthWise).kernel_w;
    iVar21 = (this->super_ConvolutionDepthWise).kernel_h;
    auVar39._0_4_ = -(uint)(iVar28 == 3);
    auVar39._4_4_ = -(uint)(iVar21 == 3);
    auVar39._8_4_ = -(uint)((this->super_ConvolutionDepthWise).dilation_w == 1);
    auVar39._12_4_ = -(uint)((this->super_ConvolutionDepthWise).dilation_h == 1);
    iVar19 = movmskps(uVar18,auVar39);
    iVar22 = (this->super_ConvolutionDepthWise).stride_w;
    iVar4 = (this->super_ConvolutionDepthWise).stride_h;
    if (iVar4 == 1 && (iVar22 == 1 && iVar19 == 0xf)) {
      convdw3x3s1_pack4_sse
                (&local_198,top_blob,&this->weight_data_tm,
                 (Mat *)(this->super_ConvolutionDepthWise).bias_data.data,pOVar30);
LAB_003dc0a4:
      pLVar7 = this->activation;
      if (pLVar7 != (Layer *)0x0) {
        (*pLVar7->_vptr_Layer[9])(pLVar7,top_blob,opt);
      }
    }
    else {
      bVar16 = (byte)iVar19;
      uVar32 = (undefined7)((ulong)pOVar30 >> 8);
      if ((iVar4 == 2 && iVar22 == 2) && bVar16 == 0xf) {
        convdw3x3s2_pack4_sse
                  (&local_198,top_blob,&this->weight_data_tm,
                   (Mat *)(this->super_ConvolutionDepthWise).bias_data.data,
                   (Option *)CONCAT71(uVar32,(iVar4 == 2 && iVar22 == 2) && bVar16 == 0xf));
        goto LAB_003dc0a4;
      }
      bVar16 = bVar16 >> 2 & bVar16 >> 3 & (iVar21 == 5 && iVar28 == 5);
      bVar29 = (iVar22 == 1 && iVar4 == 1) & bVar16;
      pOVar30 = (Option *)CONCAT71(uVar32,bVar29);
      if (bVar29 == 1) {
        convdw5x5s1_pack4_sse
                  (&local_198,top_blob,&this->weight_data_tm,
                   (Mat *)(this->super_ConvolutionDepthWise).bias_data.data,pOVar30);
        goto LAB_003dc0a4;
      }
      if ((bVar16 & (iVar22 == 2 && iVar4 == 2)) == 1) {
        convdw5x5s2_pack4_sse
                  (&local_198,top_blob,&this->weight_data_tm,
                   (Mat *)(this->super_ConvolutionDepthWise).bias_data.data,pOVar30);
        goto LAB_003dc0a4;
      }
      uVar27 = iVar21 * iVar28;
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&local_150,(long)(int)uVar27,
                 (allocator_type *)&local_1e8);
      iVar22 = (this->super_ConvolutionDepthWise).kernel_h;
      if (0 < iVar22) {
        iVar4 = (this->super_ConvolutionDepthWise).dilation_h;
        iVar28 = (this->super_ConvolutionDepthWise).kernel_w;
        iVar21 = (this->super_ConvolutionDepthWise).dilation_w * iVar28;
        iVar19 = 0;
        iVar24 = 0;
        iVar26 = 0;
        do {
          if (0 < iVar28) {
            lVar31 = 0;
            do {
              *(int *)((long)local_150.data + (iVar19 + lVar31) * 4) = iVar26;
              iVar26 = iVar26 + (this->super_ConvolutionDepthWise).dilation_w;
              iVar28 = (this->super_ConvolutionDepthWise).kernel_w;
              lVar31 = lVar31 + 1;
            } while ((int)lVar31 < iVar28);
            iVar19 = iVar19 + (int)lVar31;
            iVar22 = (this->super_ConvolutionDepthWise).kernel_h;
          }
          iVar26 = iVar26 + (iVar15 * iVar4 - iVar21);
          iVar24 = iVar24 + 1;
        } while (iVar24 < iVar22);
      }
      auVar39 = _DAT_005a59a0;
      auVar37 = _DAT_005a5960;
      if (0 < (int)uVar20) {
        local_19c = uVar27 * 4;
        iVar22 = 0;
        auVar38 = (undefined1  [16])0x0;
        uVar53 = 0xc2b0c0a5;
        uVar54 = 0xc2b0c0a5;
        uVar55 = 0xc2b0c0a5;
        uVar56 = 0xc2b0c0a5;
        fVar57 = (float)DAT_005a59a0;
        fVar58 = DAT_005a59a0._4_4_;
        fVar59 = DAT_005a59a0._8_4_;
        fVar60 = DAT_005a59a0._12_4_;
        local_220 = 0;
        do {
          if (-1 < iVar35) {
            pvVar34 = (void *)(top_blob->cstep * local_220 * top_blob->elemsize +
                              (long)top_blob->data);
            pvVar8 = (this->weight_data_tm).data;
            iVar4 = 0;
            do {
              if (-1 < iVar17) {
                uVar33 = 0;
                do {
                  if ((this->super_ConvolutionDepthWise).bias_term == 0) {
                    auVar47 = ZEXT816(0);
                  }
                  else {
                    auVar47 = *(undefined1 (*) [16])
                               ((long)(this->super_ConvolutionDepthWise).bias_data.data +
                               local_220 * 0x10);
                  }
                  if (0 < (int)uVar27) {
                    lVar31 = 0;
                    auVar43 = auVar47;
                    do {
                      auVar44 = *(undefined1 (*) [16])
                                 ((long)local_198.data +
                                 (long)*(int *)((long)local_150.data + lVar31) * 0x10 +
                                 (long)((this->super_ConvolutionDepthWise).stride_w * (int)uVar33 *
                                       4) * 4 +
                                 (long)(this->super_ConvolutionDepthWise).stride_h * (long)iVar4 *
                                 (long)local_198.w *
                                 CONCAT44(local_198.elemsize._4_4_,(undefined4)local_198.elemsize) +
                                 local_198.cstep * local_220 *
                                 CONCAT44(local_198.elemsize._4_4_,(undefined4)local_198.elemsize));
                      pfVar1 = (float *)((long)pvVar8 + lVar31 * 4 + (long)iVar22 * 4);
                      auVar47._0_4_ = auVar43._0_4_ + *pfVar1 * auVar44._0_4_;
                      auVar47._4_4_ = auVar43._4_4_ + pfVar1[1] * auVar44._4_4_;
                      auVar47._8_4_ = auVar43._8_4_ + pfVar1[2] * auVar44._8_4_;
                      auVar47._12_4_ = auVar43._12_4_ + pfVar1[3] * auVar44._12_4_;
                      lVar31 = lVar31 + 4;
                      auVar43 = auVar47;
                    } while ((ulong)uVar27 << 2 != lVar31);
                  }
                  fVar40 = auVar47._4_4_;
                  fVar49 = auVar47._8_4_;
                  fVar45 = auVar47._12_4_;
                  switch((this->super_ConvolutionDepthWise).activation_type) {
                  case 1:
                    auVar47 = maxps(auVar47,auVar38);
                    break;
                  case 2:
                    auVar43 = maxps(auVar47,auVar38);
                    auVar44 = minps(auVar47,auVar38);
                    fVar40 = *(this->super_ConvolutionDepthWise).activation_params.data;
                    auVar47._4_4_ = fVar40 * auVar44._4_4_ + auVar43._4_4_;
                    auVar47._0_4_ = fVar40 * auVar44._0_4_ + auVar43._0_4_;
                    auVar47._8_4_ = fVar40 * auVar44._8_4_ + auVar43._8_4_;
                    auVar47._12_4_ = fVar40 * auVar44._12_4_ + auVar43._12_4_;
                    break;
                  case 3:
                    puVar9 = (undefined4 *)(this->super_ConvolutionDepthWise).activation_params.data
                    ;
                    uVar2 = *puVar9;
                    uVar3 = puVar9[1];
                    auVar42._4_4_ = uVar2;
                    auVar42._0_4_ = uVar2;
                    auVar42._8_4_ = uVar2;
                    auVar42._12_4_ = uVar2;
                    auVar47 = maxps(auVar47,auVar42);
                    auVar12._4_4_ = uVar3;
                    auVar12._0_4_ = uVar3;
                    auVar12._8_4_ = uVar3;
                    auVar12._12_4_ = uVar3;
                    auVar47 = minps(auVar47,auVar12);
                    break;
                  case 4:
                    auVar46._0_8_ = auVar47._0_8_ ^ 0x8000000080000000;
                    auVar46._8_4_ = -fVar49;
                    auVar46._12_4_ = -fVar45;
                    auVar47 = minps(auVar46,auVar37);
                    auVar14._4_4_ = uVar54;
                    auVar14._0_4_ = uVar53;
                    auVar14._8_4_ = uVar55;
                    auVar14._12_4_ = uVar56;
                    auVar47 = maxps(auVar47,auVar14);
                    fVar49 = auVar47._0_4_ * 1.442695 + 0.5;
                    fVar61 = auVar47._4_4_ * 1.442695 + 0.5;
                    fVar63 = auVar47._8_4_ * 1.442695 + 0.5;
                    fVar48 = auVar47._12_4_ * 1.442695 + 0.5;
                    fVar40 = (float)(int)fVar49;
                    fVar45 = (float)(int)fVar61;
                    fVar62 = (float)(int)fVar63;
                    fVar64 = (float)(int)fVar48;
                    fVar40 = fVar40 - (float)(-(uint)(fVar49 < fVar40) & (uint)fVar57);
                    fVar45 = fVar45 - (float)(-(uint)(fVar61 < fVar45) & (uint)fVar58);
                    fVar62 = fVar62 - (float)(-(uint)(fVar63 < fVar62) & (uint)fVar59);
                    fVar64 = fVar64 - (float)(-(uint)(fVar48 < fVar64) & (uint)fVar60);
                    fVar49 = fVar40 * -0.6931472 + auVar47._0_4_;
                    fVar61 = fVar45 * -0.6931472 + auVar47._4_4_;
                    fVar63 = fVar62 * -0.6931472 + auVar47._8_4_;
                    fVar48 = fVar64 * -0.6931472 + auVar47._12_4_;
                    auVar11._4_4_ =
                         (float)((int)fVar45 * 0x800000 + (int)fVar58) *
                         (fVar61 + fVar58 +
                         (((((fVar61 * 0.00019875691 + 0.0013981999) * fVar61 + 0.008333452) *
                            fVar61 + 0.041665796) * fVar61 + 0.16666666) * fVar61 + 0.5) *
                         fVar61 * fVar61) + fVar58;
                    auVar11._0_4_ =
                         (float)((int)fVar40 * 0x800000 + (int)fVar57) *
                         (fVar49 + fVar57 +
                         (((((fVar49 * 0.00019875691 + 0.0013981999) * fVar49 + 0.008333452) *
                            fVar49 + 0.041665796) * fVar49 + 0.16666666) * fVar49 + 0.5) *
                         fVar49 * fVar49) + fVar57;
                    auVar11._8_4_ =
                         (float)((int)fVar62 * 0x800000 + (int)fVar59) *
                         (fVar63 + fVar59 +
                         (((((fVar63 * 0.00019875691 + 0.0013981999) * fVar63 + 0.008333452) *
                            fVar63 + 0.041665796) * fVar63 + 0.16666666) * fVar63 + 0.5) *
                         fVar63 * fVar63) + fVar59;
                    auVar11._12_4_ =
                         (float)((int)fVar64 * 0x800000 + (int)fVar60) *
                         (fVar48 + fVar60 +
                         (((((fVar48 * 0.00019875691 + 0.0013981999) * fVar48 + 0.008333452) *
                            fVar48 + 0.041665796) * fVar48 + 0.16666666) * fVar48 + 0.5) *
                         fVar48 * fVar48) + fVar60;
                    auVar47 = divps(auVar39,auVar11);
                    break;
                  case 5:
                    auVar38 = minps(auVar47,auVar37);
                    auVar13._4_4_ = uVar54;
                    auVar13._0_4_ = uVar53;
                    auVar13._8_4_ = uVar55;
                    auVar13._12_4_ = uVar56;
                    auVar38 = maxps(auVar38,auVar13);
                    fVar61 = auVar38._0_4_ * 1.442695 + 0.5;
                    fVar62 = auVar38._4_4_ * 1.442695 + 0.5;
                    fVar63 = auVar38._8_4_ * 1.442695 + 0.5;
                    fVar64 = auVar38._12_4_ * 1.442695 + 0.5;
                    fVar48 = (float)(int)fVar61;
                    fVar50 = (float)(int)fVar62;
                    fVar51 = (float)(int)fVar63;
                    fVar52 = (float)(int)fVar64;
                    fVar48 = fVar48 - (float)(-(uint)(fVar61 < fVar48) & (uint)fVar57);
                    fVar50 = fVar50 - (float)(-(uint)(fVar62 < fVar50) & (uint)fVar58);
                    fVar51 = fVar51 - (float)(-(uint)(fVar63 < fVar51) & (uint)fVar59);
                    fVar52 = fVar52 - (float)(-(uint)(fVar64 < fVar52) & (uint)fVar60);
                    fVar61 = auVar38._0_4_ - fVar48 * 0.6931472;
                    fVar62 = auVar38._4_4_ - fVar50 * 0.6931472;
                    fVar63 = auVar38._8_4_ - fVar51 * 0.6931472;
                    fVar64 = auVar38._12_4_ - fVar52 * 0.6931472;
                    auVar65._0_4_ =
                         (float)((int)fVar48 * 0x800000 + (int)fVar57) *
                         (fVar61 + fVar57 +
                         (((((fVar61 * 0.00019875691 + 0.0013981999) * fVar61 + 0.008333452) *
                            fVar61 + 0.041665796) * fVar61 + 0.16666666) * fVar61 + 0.5) *
                         fVar61 * fVar61) + fVar57;
                    auVar65._4_4_ =
                         (float)((int)fVar50 * 0x800000 + (int)fVar58) *
                         (fVar62 + fVar58 +
                         (((((fVar62 * 0.00019875691 + 0.0013981999) * fVar62 + 0.008333452) *
                            fVar62 + 0.041665796) * fVar62 + 0.16666666) * fVar62 + 0.5) *
                         fVar62 * fVar62) + fVar58;
                    auVar65._8_4_ =
                         (float)((int)fVar51 * 0x800000 + (int)fVar59) *
                         (fVar63 + fVar59 +
                         (((((fVar63 * 0.00019875691 + 0.0013981999) * fVar63 + 0.008333452) *
                            fVar63 + 0.041665796) * fVar63 + 0.16666666) * fVar63 + 0.5) *
                         fVar63 * fVar63) + fVar59;
                    auVar65._12_4_ =
                         (float)((int)fVar52 * 0x800000 + (int)fVar60) *
                         (fVar64 + fVar60 +
                         (((((fVar64 * 0.00019875691 + 0.0013981999) * fVar64 + 0.008333452) *
                            fVar64 + 0.041665796) * fVar64 + 0.16666666) * fVar64 + 0.5) *
                         fVar64 * fVar64) + fVar60;
                    auVar43 = maxps(auVar65,_DAT_005a5a10);
                    fVar61 = (float)(auVar43._0_4_ & 0x807fffff | 0x3f000000);
                    fVar63 = (float)(auVar43._4_4_ & 0x807fffff | 0x3f000000);
                    fVar48 = (float)(auVar43._8_4_ & 0x807fffff | 0x3f000000);
                    fVar51 = (float)(auVar43._12_4_ & 0x807fffff | 0x3f000000);
                    fVar62 = fVar61 + -1.0 + (float)(-(uint)(fVar61 < 0.70710677) & (uint)fVar61);
                    fVar64 = fVar63 + -1.0 + (float)(-(uint)(fVar63 < 0.70710677) & (uint)fVar63);
                    fVar50 = fVar48 + -1.0 + (float)(-(uint)(fVar48 < 0.70710677) & (uint)fVar48);
                    fVar52 = fVar51 + -1.0 + (float)(-(uint)(fVar51 < 0.70710677) & (uint)fVar51);
                    uVar53 = (undefined4)DAT_005a5970;
                    uVar54 = DAT_005a5970._4_4_;
                    uVar55 = DAT_005a5970._8_4_;
                    uVar56 = DAT_005a5970._12_4_;
                    auVar41._0_8_ =
                         CONCAT44(-(uint)(auVar65._4_4_ <= 0.0),-(uint)(auVar65._0_4_ <= 0.0)) &
                         0x7fffffff7fffffff;
                    auVar41._8_4_ = -(uint)(auVar65._8_4_ <= 0.0) & 0x7fffffff;
                    auVar41._12_4_ = -(uint)(auVar65._12_4_ <= 0.0) & 0x7fffffff;
                    auVar38._4_4_ =
                         ~-(uint)(auVar65._4_4_ <= 0.0) &
                         (uint)((((float)(int)((auVar43._4_4_ >> 0x17) - 0x7e) -
                                 (float)(-(uint)(fVar63 < 0.70710677) & (uint)fVar58)) * 0.6931472 +
                                 fVar64 + (((((((((fVar64 * 0.070376836 + -0.1151461) * fVar64 +
                                                 0.116769984) * fVar64 + -0.12420141) * fVar64 +
                                               0.14249323) * fVar64 + -0.16668057) * fVar64 +
                                             0.20000714) * fVar64 + -0.24999994) * fVar64 +
                                           0.3333333) * fVar64 + -0.5) * fVar64 * fVar64) * -2.0);
                    auVar38._0_4_ =
                         ~-(uint)(auVar65._0_4_ <= 0.0) &
                         (uint)((((float)(int)((auVar43._0_4_ >> 0x17) - 0x7e) -
                                 (float)(-(uint)(fVar61 < 0.70710677) & (uint)fVar57)) * 0.6931472 +
                                 fVar62 + (((((((((fVar62 * 0.070376836 + -0.1151461) * fVar62 +
                                                 0.116769984) * fVar62 + -0.12420141) * fVar62 +
                                               0.14249323) * fVar62 + -0.16668057) * fVar62 +
                                             0.20000714) * fVar62 + -0.24999994) * fVar62 +
                                           0.3333333) * fVar62 + -0.5) * fVar62 * fVar62) * -2.0);
                    auVar38._8_4_ =
                         ~-(uint)(auVar65._8_4_ <= 0.0) &
                         (uint)((((float)(int)((auVar43._8_4_ >> 0x17) - 0x7e) -
                                 (float)(-(uint)(fVar48 < 0.70710677) & (uint)fVar59)) * 0.6931472 +
                                 fVar50 + (((((((((fVar50 * 0.070376836 + -0.1151461) * fVar50 +
                                                 0.116769984) * fVar50 + -0.12420141) * fVar50 +
                                               0.14249323) * fVar50 + -0.16668057) * fVar50 +
                                             0.20000714) * fVar50 + -0.24999994) * fVar50 +
                                           0.3333333) * fVar50 + -0.5) * fVar50 * fVar50) * -2.0);
                    auVar38._12_4_ =
                         ~-(uint)(auVar65._12_4_ <= 0.0) &
                         (uint)((((float)(int)((auVar43._12_4_ >> 0x17) - 0x7e) -
                                 (float)(-(uint)(fVar51 < 0.70710677) & (uint)fVar60)) * 0.6931472 +
                                 fVar52 + (((((((((fVar52 * 0.070376836 + -0.1151461) * fVar52 +
                                                 0.116769984) * fVar52 + -0.12420141) * fVar52 +
                                               0.14249323) * fVar52 + -0.16668057) * fVar52 +
                                             0.20000714) * fVar52 + -0.24999994) * fVar52 +
                                           0.3333333) * fVar52 + -0.5) * fVar52 * fVar52) * -2.0);
                    auVar38 = minps(auVar41 | auVar38,auVar37);
                    auVar38 = maxps(auVar38,_DAT_005a5970);
                    fVar61 = auVar38._0_4_ * 1.442695 + 0.5;
                    fVar62 = auVar38._4_4_ * 1.442695 + 0.5;
                    fVar63 = auVar38._8_4_ * 1.442695 + 0.5;
                    fVar64 = auVar38._12_4_ * 1.442695 + 0.5;
                    fVar48 = (float)(int)fVar61;
                    fVar50 = (float)(int)fVar62;
                    fVar51 = (float)(int)fVar63;
                    fVar52 = (float)(int)fVar64;
                    fVar48 = fVar48 - (float)(-(uint)(fVar61 < fVar48) & (uint)fVar57);
                    fVar50 = fVar50 - (float)(-(uint)(fVar62 < fVar50) & (uint)fVar58);
                    fVar51 = fVar51 - (float)(-(uint)(fVar63 < fVar51) & (uint)fVar59);
                    fVar52 = fVar52 - (float)(-(uint)(fVar64 < fVar52) & (uint)fVar60);
                    fVar61 = auVar38._0_4_ - fVar48 * 0.6931472;
                    fVar62 = auVar38._4_4_ - fVar50 * 0.6931472;
                    fVar63 = auVar38._8_4_ - fVar51 * 0.6931472;
                    fVar64 = auVar38._12_4_ - fVar52 * 0.6931472;
                    auVar38 = ZEXT816(0);
                    auVar10._4_4_ =
                         (float)((int)fVar50 * 0x800000 + (int)fVar58) *
                         (fVar62 + fVar58 +
                         (((((fVar62 * 0.00019875691 + 0.0013981999) * fVar62 + 0.008333452) *
                            fVar62 + 0.041665796) * fVar62 + 0.16666666) * fVar62 + 0.5) *
                         fVar62 * fVar62) + fVar58;
                    auVar10._0_4_ =
                         (float)((int)fVar48 * 0x800000 + (int)fVar57) *
                         (fVar61 + fVar57 +
                         (((((fVar61 * 0.00019875691 + 0.0013981999) * fVar61 + 0.008333452) *
                            fVar61 + 0.041665796) * fVar61 + 0.16666666) * fVar61 + 0.5) *
                         fVar61 * fVar61) + fVar57;
                    auVar10._8_4_ =
                         (float)((int)fVar51 * 0x800000 + (int)fVar59) *
                         (fVar63 + fVar59 +
                         (((((fVar63 * 0.00019875691 + 0.0013981999) * fVar63 + 0.008333452) *
                            fVar63 + 0.041665796) * fVar63 + 0.16666666) * fVar63 + 0.5) *
                         fVar63 * fVar63) + fVar59;
                    auVar10._12_4_ =
                         (float)((int)fVar52 * 0x800000 + (int)fVar60) *
                         (fVar64 + fVar60 +
                         (((((fVar64 * 0.00019875691 + 0.0013981999) * fVar64 + 0.008333452) *
                            fVar64 + 0.041665796) * fVar64 + 0.16666666) * fVar64 + 0.5) *
                         fVar64 * fVar64) + fVar60;
                    auVar43 = divps(_DAT_005a6620,auVar10);
                    auVar44._0_4_ = auVar43._0_4_ + -1.0;
                    auVar44._4_4_ = auVar43._4_4_ + -1.0;
                    auVar44._8_4_ = auVar43._8_4_ + -1.0;
                    auVar44._12_4_ = auVar43._12_4_ + -1.0;
                    goto LAB_003dc649;
                  case 6:
                    pfVar1 = (float *)(this->super_ConvolutionDepthWise).activation_params.data;
                    fVar61 = *pfVar1;
                    fVar62 = pfVar1[1];
                    auVar43._0_4_ = fVar61 * auVar47._0_4_ + fVar62;
                    auVar43._4_4_ = fVar61 * fVar40 + fVar62;
                    auVar43._8_4_ = fVar61 * fVar49 + fVar62;
                    auVar43._12_4_ = fVar61 * fVar45 + fVar62;
                    auVar43 = maxps(auVar43,auVar38);
                    auVar44 = minps(auVar43,auVar39);
LAB_003dc649:
                    auVar47._0_4_ = auVar47._0_4_ * auVar44._0_4_;
                    auVar47._4_4_ = fVar40 * auVar44._4_4_;
                    auVar47._8_4_ = fVar49 * auVar44._8_4_;
                    auVar47._12_4_ = fVar45 * auVar44._12_4_;
                  }
                  *(undefined1 (*) [16])((long)pvVar34 + uVar33 * 0x10) = auVar47;
                  uVar33 = uVar33 + 1;
                } while (uVar33 != _w);
              }
              pvVar34 = (void *)((long)pvVar34 + (long)(int)(_w * 4) * 4);
              bVar36 = iVar4 != iVar35;
              iVar4 = iVar4 + 1;
            } while (bVar36);
          }
          local_220 = local_220 + 1;
          iVar22 = iVar22 + local_19c;
        } while (local_220 != uVar20);
      }
      if (local_150.data != (void *)0x0) {
        operator_delete(local_150.data,local_150.elemsize - (long)local_150.data);
      }
    }
    iVar21 = 0;
    goto LAB_003dc794;
  }
LAB_003dbaa4:
  uVar18 = (int)uVar18 / (int)uVar5;
  uVar27 = (int)uVar27 / (int)uVar5;
  local_230 = 1;
  uVar20 = 1;
  if (opt->use_packing_layout == true) {
    local_230 = (uint)((uVar18 & 3) == 0) * 3 + 1;
    uVar20 = (uint)((uVar27 & 3) == 0) * 3 + 1;
  }
  local_150.refcount = (int *)CONCAT44(local_198.refcount._4_4_,local_198.refcount._0_4_);
  local_150.data = local_198.data;
  local_150.elemsize = CONCAT44(local_198.elemsize._4_4_,(undefined4)local_198.elemsize);
  local_150.elempack = local_198.elempack;
  local_150.allocator = local_198.allocator;
  local_150.w = local_198.w;
  local_150.dims = local_198.dims;
  local_150.d = local_198.d;
  local_150.h = local_198.h;
  local_150.c = local_198.c;
  local_150.cstep = local_198.cstep;
  if (local_150.refcount != (int *)0x0) {
    LOCK();
    *local_150.refcount = *local_150.refcount + 1;
    UNLOCK();
  }
  if (local_230 < iVar28) {
    local_1e8.data = *(void **)opt;
    local_1e8.elemsize = (size_t)opt->workspace_allocator;
    local_1e8.elempack = opt->openmp_blocktime;
    local_1e8._28_1_ = opt->use_winograd_convolution;
    local_1e8._29_1_ = opt->use_sgemm_convolution;
    local_1e8._30_1_ = opt->use_int8_inference;
    local_1e8._31_1_ = opt->use_vulkan_compute;
    local_1e8.allocator = *(Allocator **)&opt->use_bf16_storage;
    local_1e8._40_8_ = *(undefined8 *)&opt->vulkan_device_index;
    local_1e8._48_8_ = *(undefined8 *)&opt->flush_denormals;
    local_1e8._56_8_ = *(undefined8 *)&opt->use_winograd43_convolution;
    local_1e8.refcount = (int *)opt->workspace_allocator;
    convert_packing(&local_198,&local_150,local_230,(Option *)&local_1e8);
    if ((local_150.data != (void *)0x0) && ((long)local_150.c * local_150.cstep != 0))
    goto LAB_003dbbee;
    iVar21 = -100;
  }
  else {
LAB_003dbbee:
    local_1e8.data = top_blob->data;
    local_1e8.refcount = top_blob->refcount;
    local_1e8.elemsize = top_blob->elemsize;
    local_1e8.elempack = top_blob->elempack;
    local_1e8.allocator = top_blob->allocator;
    local_1e8.dims = top_blob->dims;
    local_1e8.w = top_blob->w;
    local_1e8.h = top_blob->h;
    local_1e8.d = top_blob->d;
    local_1e8.c = top_blob->c;
    local_1e8.cstep = top_blob->cstep;
    if ((Allocator *)local_1e8.refcount != (Allocator *)0x0) {
      LOCK();
      *(int *)&((Allocator *)local_1e8.refcount)->_vptr_Allocator =
           *(int *)&((Allocator *)local_1e8.refcount)->_vptr_Allocator + 1;
      UNLOCK();
    }
    if (uVar20 < _elempack) {
      Mat::create(&local_1e8,_w,iVar35 + 1,
                  (this->super_ConvolutionDepthWise).num_output / (int)uVar20,
                  (ulong)uVar20 * ((ulong)_elemsize >> sVar23),uVar20,opt->workspace_allocator);
      iVar21 = -100;
      if ((local_1e8.data != (void *)0x0) && ((long)local_1e8.c * local_1e8.cstep != 0))
      goto LAB_003dbcae;
    }
    else {
LAB_003dbcae:
      if (0 < (this->super_ConvolutionDepthWise).group) {
        iVar17 = 0;
        iVar35 = 0;
        lVar31 = 0;
        do {
          local_c0 = (pointer)((long)(iVar17 / local_230) * local_150.cstep * local_150.elemsize +
                              (long)local_150.data);
          local_b8 = (int *)0x0;
          local_b0 = local_150.elemsize;
          local_a8 = local_150.elempack;
          local_a0 = local_150.allocator;
          local_94 = local_150.w;
          local_90 = local_150.h;
          local_8c = local_150.d;
          local_80 = ((long)local_150.d * local_150.elemsize * (long)local_150.h * (long)local_150.w
                      + 0xf & 0xfffffffffffffff0) / local_150.elemsize;
          local_98 = local_150.dims;
          local_108 = (void *)((long)(iVar35 / (int)uVar20) * local_1e8.cstep * local_1e8.elemsize +
                              (long)local_1e8.data);
          local_100 = (int *)0x0;
          local_f8 = (Allocator *)local_1e8.elemsize;
          local_f0 = local_1e8.elempack;
          local_e8 = local_1e8.allocator;
          local_dc = local_1e8.w;
          local_d8 = local_1e8.h;
          local_d4 = local_1e8.d;
          local_c8 = ((long)local_1e8.d * local_1e8.elemsize * (long)local_1e8.h * (long)local_1e8.w
                      + 0xf & 0xfffffffffffffff0) / local_1e8.elemsize;
          local_e0 = local_1e8.dims;
          pLVar7 = (this->group_ops).
                   super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar31];
          local_78._0_1_ = opt->lightmode;
          local_78._1_1_ = opt->use_shader_pack8;
          local_78._2_1_ = opt->use_subgroup_ops;
          local_78._3_1_ = opt->use_reserved_0;
          local_78._4_4_ = opt->num_threads;
          local_68 = opt->workspace_allocator;
          uStack_60._0_4_ = opt->openmp_blocktime;
          uStack_60._4_1_ = opt->use_winograd_convolution;
          uStack_60._5_1_ = opt->use_sgemm_convolution;
          uStack_60._6_1_ = opt->use_int8_inference;
          uStack_60._7_1_ = opt->use_vulkan_compute;
          local_58._0_1_ = opt->use_bf16_storage;
          local_58._1_1_ = opt->use_fp16_packed;
          local_58._2_1_ = opt->use_fp16_storage;
          local_58._3_1_ = opt->use_fp16_arithmetic;
          local_58._4_1_ = opt->use_int8_packed;
          local_58._5_1_ = opt->use_int8_storage;
          local_58._6_1_ = opt->use_int8_arithmetic;
          local_58._7_1_ = opt->use_packing_layout;
          uStack_50._0_4_ = opt->vulkan_device_index;
          uStack_50._4_1_ = opt->use_reserved_1;
          uStack_50._5_1_ = opt->use_image_storage;
          uStack_50._6_1_ = opt->use_tensor_storage;
          uStack_50._7_1_ = opt->use_reserved_2;
          local_48 = opt->flush_denormals;
          uStack_44._0_1_ = opt->use_local_pool_allocator;
          uStack_44._1_1_ = opt->use_shader_local_memory;
          uStack_44._2_1_ = opt->use_cooperative_matrix;
          uStack_44._3_1_ = opt->use_winograd23_convolution;
          uStack_40._0_1_ = opt->use_winograd43_convolution;
          uStack_40._1_1_ = opt->use_winograd63_convolution;
          uStack_40._2_1_ = opt->use_a53_a55_optimized_kernel;
          uStack_40._3_1_ = opt->use_fp16_uniform;
          uStack_3c._0_1_ = opt->use_int8_uniform;
          uStack_3c._1_1_ = opt->use_reserved_9;
          uStack_3c._2_1_ = opt->use_reserved_10;
          uStack_3c._3_1_ = opt->use_reserved_11;
          pAStack_70 = local_1e8.allocator;
          local_d0 = (int)uVar27 / (int)uVar20;
          local_88 = (int)uVar18 / local_230;
          iVar21 = (*pLVar7->_vptr_Layer[7])(pLVar7,&local_c0,&local_108,&local_78);
          if (local_100 != (int *)0x0) {
            LOCK();
            *local_100 = *local_100 + -1;
            UNLOCK();
            if (*local_100 == 0) {
              if (local_e8 == (Allocator *)0x0) {
                if (local_108 != (void *)0x0) {
                  free(local_108);
                }
              }
              else {
                (*local_e8->_vptr_Allocator[3])();
              }
            }
          }
          if (local_b8 != (int *)0x0) {
            LOCK();
            *local_b8 = *local_b8 + -1;
            UNLOCK();
            if (*local_b8 == 0) {
              if (local_a0 == (Allocator *)0x0) {
                if (local_c0 != (pointer)0x0) {
                  free(local_c0);
                }
              }
              else {
                (*local_a0->_vptr_Allocator[3])();
              }
            }
          }
          if (iVar21 != 0) goto LAB_003dc725;
          lVar31 = lVar31 + 1;
          iVar35 = iVar35 + uVar27;
          iVar17 = iVar17 + uVar18;
        } while (lVar31 < (this->super_ConvolutionDepthWise).group);
      }
      if (uVar20 < _elempack) {
        convert_packing(&local_1e8,top_blob,_elempack,opt);
        iVar21 = -100;
        if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0))
        goto LAB_003dc725;
      }
      else if (&local_1e8 != top_blob) {
        if ((Allocator *)local_1e8.refcount != (Allocator *)0x0) {
          LOCK();
          *(int *)(_func_int ***)local_1e8.refcount = *(int *)(_func_int ***)local_1e8.refcount + 1;
          UNLOCK();
        }
        piVar6 = top_blob->refcount;
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + -1;
          UNLOCK();
          if (*piVar6 == 0) {
            if (top_blob->allocator == (Allocator *)0x0) {
              if (top_blob->data != (void *)0x0) {
                free(top_blob->data);
              }
            }
            else {
              (*top_blob->allocator->_vptr_Allocator[3])();
            }
          }
        }
        top_blob->data = local_1e8.data;
        top_blob->refcount = local_1e8.refcount;
        top_blob->elemsize = local_1e8.elemsize;
        top_blob->elempack = local_1e8.elempack;
        top_blob->allocator = local_1e8.allocator;
        top_blob->dims = local_1e8.dims;
        top_blob->w = local_1e8.w;
        top_blob->h = local_1e8.h;
        top_blob->d = local_1e8.d;
        top_blob->c = local_1e8.c;
        top_blob->cstep = local_1e8.cstep;
      }
      iVar21 = 0;
    }
LAB_003dc725:
    if ((Allocator *)local_1e8.refcount != (Allocator *)0x0) {
      LOCK();
      *(int *)(_func_int ***)local_1e8.refcount = *(int *)(_func_int ***)local_1e8.refcount + -1;
      UNLOCK();
      if (*(int *)(_func_int ***)local_1e8.refcount == 0) {
        if (local_1e8.allocator == (Allocator *)0x0) {
          if (local_1e8.data != (void *)0x0) {
            free(local_1e8.data);
          }
        }
        else {
          (*(local_1e8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  if (local_150.refcount != (int *)0x0) {
    LOCK();
    *local_150.refcount = *local_150.refcount + -1;
    UNLOCK();
    if (*local_150.refcount == 0) {
      if (local_150.allocator == (Allocator *)0x0) {
        if (local_150.data != (void *)0x0) {
          free(local_150.data);
        }
      }
      else {
        (*(local_150.allocator)->_vptr_Allocator[3])();
      }
    }
  }
LAB_003dc794:
  piVar6 = (int *)CONCAT44(local_198.refcount._4_4_,local_198.refcount._0_4_);
  if (piVar6 != (int *)0x0) {
    LOCK();
    *piVar6 = *piVar6 + -1;
    UNLOCK();
    if (*piVar6 == 0) {
      if (local_198.allocator == (Allocator *)0x0) {
        if (local_198.data != (void *)0x0) {
          free(local_198.data);
        }
      }
      else {
        (*(local_198.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar21;
}

Assistant:

int ConvolutionDepthWise_x86::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
#if NCNN_INT8
    if (opt.use_int8_inference && int8_scale_term)
    {
        return forward_int8_x86(bottom_blob, top_blob, opt);
    }
#endif

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    top_blob.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // depth-wise
    if (channels * elempack == group && group == num_output)
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw3x3s1_pack16_avx512(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw3x3s2_pack16_avx512(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw5x5s1_pack16_avx512(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw5x5s2_pack16_avx512(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            else
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 16;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m512 _sum = _mm512_set1_ps(0.f);

                            if (bias_term)
                            {
                                _sum = _mm512_loadu_ps(((const float*)bias_data) + g * 16);
                            }

                            const float* sptr = m.row(i * stride_h) + j * stride_w * 16;

                            for (int k = 0; k < maxk; k++)
                            {
                                __m512 _val = _mm512_loadu_ps(sptr + space_ofs[k] * 16);
                                __m512 _w = _mm512_loadu_ps(kptr + k * 16);
                                _sum = _mm512_fmadd_ps(_val, _w, _sum);
                            }

                            _mm512_storeu_ps(outptr, _sum);
                            outptr += 16;
                        }
                    }
                }

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
        }
#endif // __AVX512F__
        if (elempack == 8)
        {
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw3x3s1_pack8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw3x3s2_pack8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw5x5s1_pack8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw5x5s2_pack8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            else
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 8;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m256 _sum = _mm256_set1_ps(0.f);

                            if (bias_term)
                            {
                                _sum = _mm256_loadu_ps(((const float*)bias_data) + g * 8);
                            }

                            const float* sptr = m.row(i * stride_h) + j * stride_w * 8;

                            for (int k = 0; k < maxk; k++)
                            {
                                __m256 _val = _mm256_loadu_ps(sptr + space_ofs[k] * 8);
                                __m256 _w = _mm256_loadu_ps(kptr + k * 8);
                                _sum = _mm256_comp_fmadd_ps(_val, _w, _sum);
                            }

                            _mm256_storeu_ps(outptr + j * 8, _sum);
                        }

                        outptr += outw * 8;
                    }
                }

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
        }
#endif // __AVX__

        if (elempack == 4)
        {
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw3x3s1_pack4_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw3x3s2_pack4_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw5x5s1_pack4_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw5x5s2_pack4_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 4;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m128 _sum = _mm_set1_ps(0.f);

                            if (bias_term)
                            {
                                _sum = _mm_loadu_ps(((const float*)bias_data) + g * 4);
                            }

                            const float* sptr = m.row(i * stride_h) + j * stride_w * 4;

                            for (int k = 0; k < maxk; k++)
                            {
                                __m128 _val = _mm_loadu_ps(sptr + space_ofs[k] * 4);
                                __m128 _w = _mm_loadu_ps(kptr + k * 4);
                                _sum = _mm_add_ps(_mm_mul_ps(_val, _w), _sum);
                            }

                            _sum = activation_sse(_sum, activation_type, activation_params);

                            _mm_storeu_ps(outptr + j * 4, _sum);
                        }

                        outptr += outw * 4;
                    }
                }

                return 0;
            }
        }
#endif // __SSE2__

        if (elempack == 1)
        {
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw3x3s1_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw3x3s2_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
        }
    }

    // group convolution
    const int channels_g = channels * elempack / group;
    const int num_output_g = num_output / group;

    int g_elempack = 1;
    int out_g_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        g_elempack = channels_g % 16 == 0 ? 16 : channels_g % 8 == 0 ? 8 : channels_g % 4 == 0 ? 4 : 1;
        out_g_elempack = num_output_g % 16 == 0 ? 16 : num_output_g % 8 == 0 ? 8 : num_output_g % 4 == 0 ? 4 : 1;
#elif __AVX__
        g_elempack = channels_g % 8 == 0 ? 8 : channels_g % 4 == 0 ? 4 : 1;
        out_g_elempack = num_output_g % 8 == 0 ? 8 : num_output_g % 4 == 0 ? 4 : 1;
#else
        g_elempack = channels_g % 4 == 0 ? 4 : 1;
        out_g_elempack = num_output_g % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__

    // unpacking
    Mat bottom_blob_bordered_unpacked = bottom_blob_bordered;
    if (elempack > g_elempack)
    {
        Option opt_p = opt;
        opt_p.blob_allocator = opt.workspace_allocator;
        convert_packing(bottom_blob_bordered, bottom_blob_bordered_unpacked, g_elempack, opt_p);
        if (bottom_blob_bordered_unpacked.empty())
            return -100;
    }

    Mat top_blob_unpacked = top_blob;
    if (out_g_elempack < out_elempack)
    {
        top_blob_unpacked.create(outw, outh, num_output / out_g_elempack, out_elemsize / out_elempack * out_g_elempack, out_g_elempack, opt.workspace_allocator);
        if (top_blob_unpacked.empty())
            return -100;
    }

    for (int g = 0; g < group; g++)
    {
        const Mat bottom_blob_bordered_g = bottom_blob_bordered_unpacked.channel_range(channels_g * g / g_elempack, channels_g / g_elempack);
        Mat top_blob_g = top_blob_unpacked.channel_range(num_output_g * g / out_g_elempack, num_output_g / out_g_elempack);

        const ncnn::Layer* op = group_ops[g];

        Option opt_g = opt;
        opt_g.blob_allocator = top_blob_unpacked.allocator;

        // forward
        int ret = op->forward(bottom_blob_bordered_g, top_blob_g, opt_g);
        if (ret != 0)
            return ret;
    }

    // packing
    if (out_g_elempack < out_elempack)
    {
        convert_packing(top_blob_unpacked, top_blob, out_elempack, opt);
        if (top_blob.empty())
            return -100;
    }
    else
    {
        top_blob = top_blob_unpacked;
    }

    return 0;
}